

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O2

string * __thiscall
CppUnit::TestPath::toString_abi_cxx11_(string *__return_storage_ptr__,TestPath *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  string asStack_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"/",(allocator<char> *)asStack_48);
  uVar2 = 0;
  while( true ) {
    iVar1 = (*this->_vptr_TestPath[10])(this);
    if (iVar1 <= (int)uVar2) break;
    if (uVar2 != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    iVar1 = (*this->_vptr_TestPath[0xb])(this,(ulong)uVar2);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
              (asStack_48,(long *)CONCAT44(extraout_var,iVar1));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(asStack_48);
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string 
TestPath::toString() const
{
  std::string asString( "/" );
  for ( int index =0; index < getTestCount(); ++index )
  {
    if ( index > 0 )
      asString += '/';
    asString += getTestAt(index)->getName();
  }

  return asString;
}